

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriter.cpp
# Opt level: O0

void __thiscall
MILBlob::Blob::StorageWriter::Impl::Impl(Impl *this,string *filePath,bool truncateFile)

{
  pointer pFVar1;
  runtime_error *prVar2;
  Span<unsigned_char,_18446744073709551615UL> destData;
  Span<unsigned_char,_18446744073709551615UL> local_78;
  Span<const_unsigned_char,_18446744073709551615UL> local_68;
  uint64_t local_58;
  uint64_t fileSize;
  Span<unsigned_char,_18446744073709551615UL> local_40;
  Span<const_unsigned_char,_18446744073709551615UL> local_30;
  byte local_19;
  string *psStack_18;
  bool truncateFile_local;
  string *filePath_local;
  Impl *this_local;
  
  local_19 = truncateFile;
  psStack_18 = filePath;
  filePath_local = (string *)this;
  std::make_unique<MILBlob::Blob::FileWriter,std::__cxx11::string_const&,bool&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (bool *)filePath);
  storage_header::storage_header(&this->m_header);
  if ((local_19 & 1) == 0) {
    pFVar1 = std::
             unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
             ::operator->(&this->m_fileWriter);
    local_58 = FileWriter::GetFileSize(pFVar1);
    if (local_58 == 0) {
      pFVar1 = std::
               unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
               ::operator->(&this->m_fileWriter);
      local_78 = anon_unknown.dwarf_560e6::CastAndMakeSpan<MILBlob::Blob::storage_header>
                           (&this->m_header);
      Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
                (&local_68,&local_78);
      FileWriter::WriteData(pFVar1,local_68,0);
    }
    else {
      if (local_58 < 0x40) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar2,"[MIL StorageWriter]: Incorrect file header, please use truncateFile=true"
                  );
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pFVar1 = std::
               unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
               ::operator->(&this->m_fileWriter);
      destData = anon_unknown.dwarf_560e6::CastAndMakeSpan<MILBlob::Blob::storage_header>
                           (&this->m_header);
      FileWriter::ReadData(pFVar1,0,destData);
      if ((this->m_header).version != 2) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar2,"[MIL StorageWriter]: Incorrect file header, please use truncateFile=true"
                  );
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    pFVar1 = std::
             unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
             ::operator->(&this->m_fileWriter);
    local_40 = anon_unknown.dwarf_560e6::CastAndMakeSpan<MILBlob::Blob::storage_header>
                         (&this->m_header);
    Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
              (&local_30,&local_40);
    FileWriter::WriteData(pFVar1,local_30,0);
  }
  return;
}

Assistant:

Impl(const std::string& filePath, bool truncateFile)
        : m_fileWriter(std::make_unique<FileWriter>(filePath, truncateFile))
    {
        if (truncateFile) {
            m_fileWriter->WriteData(CastAndMakeSpan(m_header), 0);
        } else {
            auto fileSize = m_fileWriter->GetFileSize();
            if (fileSize == 0) {
                // File exists and is empty
                m_fileWriter->WriteData(CastAndMakeSpan(m_header), 0);
            } else if (static_cast<size_t>(fileSize) >= sizeof(m_header)) {
                m_fileWriter->ReadData(0, CastAndMakeSpan(m_header));
                if (m_header.version != 2) {
                    // File exists and header is incorrect
                    // File is not empty, please use truncate option
                    throw std::runtime_error(
                        "[MIL StorageWriter]: Incorrect file header, please use truncateFile=true");
                }
            } else {
                // File is not empty, please use truncate option
                throw std::runtime_error("[MIL StorageWriter]: Incorrect file header, please use truncateFile=true");
            }
        }
    }